

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_insert.cpp
# Opt level: O1

void duckdb::CheckInsertColumnCountMismatch
               (idx_t expected_columns,idx_t result_columns,bool columns_provided,char *tname)

{
  char *pcVar1;
  BinderException *this;
  char *pcVar2;
  unsigned_long in_R9;
  string msg;
  Exception local_68;
  undefined1 local_58 [16];
  string local_48;
  
  if (result_columns == expected_columns) {
    return;
  }
  pcVar2 = "table %s has %lld columns but %lld values were supplied";
  if (columns_provided) {
    pcVar2 = 
    "Column name/value mismatch for insert on %s: expected %lld columns but %lld values were supplied"
    ;
  }
  pcVar1 = pcVar2 + 0x37;
  if (columns_provided) {
    pcVar1 = pcVar2 + 0x60;
  }
  local_68._0_8_ = local_58;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,pcVar2,pcVar1);
  Exception::ConstructMessage<char_const*,unsigned_long,unsigned_long>
            (&local_48,&local_68,(string *)tname,(char *)expected_columns,result_columns,in_R9);
  if ((undefined1 *)local_68._0_8_ != local_58) {
    operator_delete((void *)local_68._0_8_);
  }
  this = (BinderException *)__cxa_allocate_exception(0x10);
  BinderException::BinderException(this,&local_48);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void CheckInsertColumnCountMismatch(idx_t expected_columns, idx_t result_columns, bool columns_provided,
                                           const char *tname) {
	if (result_columns != expected_columns) {
		string msg = StringUtil::Format(!columns_provided ? "table %s has %lld columns but %lld values were supplied"
		                                                  : "Column name/value mismatch for insert on %s: "
		                                                    "expected %lld columns but %lld values were supplied",
		                                tname, expected_columns, result_columns);
		throw BinderException(msg);
	}
}